

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O2

void __thiscall QBuffer::setData(QBuffer *this,char *data,qsizetype size)

{
  QObjectData *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  bVar2 = QIODevice::isOpen(&this->super_QIODevice);
  if (bVar2) {
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning(&local_40,"QBuffer::setData: Buffer is open");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QByteArray::assign<const_char_*,_true>
              ((QByteArray *)pQVar1[4].bindingStorage.bindingStatus,data,data + size);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBuffer::setData(const char *data, qsizetype size)
{
    Q_D(QBuffer);
    if (isOpen()) {
        qWarning("QBuffer::setData: Buffer is open");
        return;
    }
    d->buf->assign(data, data + size);
}